

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::TraverseSchema::checkContent
          (TraverseSchema *this,DOMElement *rootElem,DOMElement *contentElem,bool isEmpty,
          bool processAnnot)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XSAnnotation *pXVar3;
  undefined4 extraout_var_00;
  Janitor<xercesc_4_0::XSAnnotation> local_48;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  XMLCh *name;
  DOMElement *content;
  bool processAnnot_local;
  bool isEmpty_local;
  DOMElement *contentElem_local;
  DOMElement *rootElem_local;
  TraverseSchema *this_local;
  
  janAnnot.fData =
       (XSAnnotation *)getElementAttValue(this,rootElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  this->fAnnotation = (XSAnnotation *)0x0;
  Janitor<xercesc_4_0::XSAnnotation>::Janitor(&local_48,(XSAnnotation *)0x0);
  if (contentElem == (DOMElement *)0x0) {
    if (!isEmpty) {
      reportSchemaError(this,rootElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x23,(XMLCh *)janAnnot.fData,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    this_local = (TraverseSchema *)0x0;
    goto LAB_00424ca2;
  }
  iVar2 = (*(contentElem->super_DOMNode)._vptr_DOMNode[0x18])();
  bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),
                            (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
  name = (XMLCh *)contentElem;
  if (bVar1) {
    if (processAnnot) {
      pXVar3 = traverseAnnotationDecl(this,contentElem,this->fNonXSAttList,false);
      Janitor<xercesc_4_0::XSAnnotation>::reset(&local_48,pXVar3);
    }
    name = (XMLCh *)XUtil::getNextSiblingElement(&contentElem->super_DOMNode);
    if ((DOMElement *)name == (DOMElement *)0x0) {
      if (!isEmpty) {
        reportSchemaError(this,contentElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x23,
                          (XMLCh *)janAnnot.fData,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      pXVar3 = Janitor<xercesc_4_0::XSAnnotation>::release(&local_48);
      this->fAnnotation = pXVar3;
      this_local = (TraverseSchema *)0x0;
      goto LAB_00424ca2;
    }
    iVar2 = (*(((DOMElement *)name)->super_DOMNode)._vptr_DOMNode[0x18])();
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar2),
                              (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (bVar1) {
      reportSchemaError(this,(DOMElement *)name,(XMLCh *)XMLUni::fgXMLErrDomain,0x3d,
                        (XMLCh *)janAnnot.fData,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (TraverseSchema *)0x0;
      goto LAB_00424ca2;
    }
    pXVar3 = Janitor<xercesc_4_0::XSAnnotation>::release(&local_48);
    this->fAnnotation = pXVar3;
  }
  this_local = (TraverseSchema *)name;
LAB_00424ca2:
  Janitor<xercesc_4_0::XSAnnotation>::~Janitor(&local_48);
  return (DOMElement *)this_local;
}

Assistant:

DOMElement* TraverseSchema::checkContent( const DOMElement* const rootElem
                                        , DOMElement* const contentElem
                                        , const bool isEmpty
                                        , const bool processAnnot)
{
    DOMElement* content = contentElem;
    const XMLCh* name = getElementAttValue(rootElem,SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    fAnnotation = 0;
    Janitor<XSAnnotation> janAnnot(0);
    if (!content) {

       if (!isEmpty) {
           reportSchemaError(rootElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
       }

       return 0;
    }

    if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

        if (processAnnot) {
            janAnnot.reset(traverseAnnotationDecl(content, fNonXSAttList));
        }
        content = XUtil::getNextSiblingElement(content);

        if (!content) { // must be followed by content

            if (!isEmpty) {
                reportSchemaError(contentElem, XMLUni::fgXMLErrDomain, XMLErrs::ContentError, name);
            }
            fAnnotation = janAnnot.release();
            return 0;
        }

        if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {

            reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnnotationError, name);
            return 0;
        }
        fAnnotation = janAnnot.release();
    }
    return content;
}